

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSDDOMParser.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::XSDDOMParser::startAnnotation
          (XSDDOMParser *this,XMLElementDecl *elemDecl,RefVectorOf<xercesc_4_0::XMLAttr> *attrList,
          XMLSize_t attrCount)

{
  XMLBuffer *this_00;
  short *psVar1;
  short *psVar2;
  XMLCh XVar3;
  uint uVar4;
  RefHashTableOf<xercesc_4_0::XMLStringPool::PoolElem,_xercesc_4_0::StringHasher> *pRVar5;
  undefined2 *puVar6;
  uint *puVar7;
  XMLScanner *pXVar8;
  ulong uVar9;
  bool bVar10;
  int iVar11;
  XMLCh *pXVar12;
  XMLAttr *this_01;
  XMLCh *pXVar13;
  ulong uVar14;
  PoolElem *pPVar15;
  ValueVectorOf<xercesc_4_0::PrefMapElem_*> *this_02;
  PrefMapElem **ppPVar16;
  XMLSize_t XVar17;
  IllegalArgumentException *this_03;
  XMLCh *pXVar18;
  XMLSize_t XVar19;
  XMLSize_t XVar20;
  XMLCh XVar21;
  long lVar22;
  ulong uVar23;
  RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *pRVar24;
  ValueVectorOf<unsigned_int> *pVVar25;
  XMLSize_t XVar26;
  uint local_6c;
  
  this_00 = &this->fAnnotationBuf;
  XVar26 = (this->fAnnotationBuf).fIndex;
  if (XVar26 == (this->fAnnotationBuf).fCapacity) {
    XMLBuffer::ensureCapacity(this_00,1);
    XVar26 = this_00->fIndex;
  }
  (this->fAnnotationBuf).fIndex = XVar26 + 1;
  (this->fAnnotationBuf).fBuffer[XVar26] = L'<';
  pXVar12 = QName::getRawName(elemDecl->fElementName);
  XMLBuffer::append(this_00,pXVar12);
  XVar26 = (this->fAnnotationBuf).fIndex;
  if (XVar26 == (this->fAnnotationBuf).fCapacity) {
    XMLBuffer::ensureCapacity(this_00,1);
    XVar26 = this_00->fIndex;
  }
  (this->fAnnotationBuf).fIndex = XVar26 + 1;
  (this->fAnnotationBuf).fBuffer[XVar26] = L' ';
  this->fURIs->fCurCount = 0;
  if (attrCount != 0) {
    XVar26 = 0;
    do {
      this_01 = BaseRefVectorOf<xercesc_4_0::XMLAttr>::elementAt
                          (&attrList->super_BaseRefVectorOf<xercesc_4_0::XMLAttr>,XVar26);
      pXVar12 = this_01->fValue;
      pXVar13 = this_01->fAttName->fLocalPart;
      if (pXVar13 == L"xmlns") {
LAB_003390c3:
        pVVar25 = this->fURIs;
        for (pRVar24 = *((((this->super_XercesDOMParser).super_AbstractDOMParser.fScanner)->
                         fElemStack).fPrefixPool.fHashTable)->fBucketList;
            pRVar24 != (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0;
            pRVar24 = pRVar24->fNext) {
          puVar6 = (undefined2 *)pRVar24->fKey;
          if ((puVar6 == &XMLUni::fgZeroLenString) || (puVar6 == (undefined2 *)0x0)) {
LAB_0033917c:
            local_6c = 0;
            pPVar15 = pRVar24->fData;
            if (pPVar15 == (PoolElem *)0x0) goto LAB_00339206;
            goto LAB_00339200;
          }
          lVar22 = 0;
          do {
            psVar1 = (short *)((long)&XMLUni::fgZeroLenString + lVar22);
            if (*psVar1 == 0) {
              if (*(short *)((long)puVar6 + lVar22) == 0) goto LAB_0033917c;
              break;
            }
            psVar2 = (short *)((long)puVar6 + lVar22);
            lVar22 = lVar22 + 2;
          } while (*psVar1 == *psVar2);
        }
        local_6c = 0;
LAB_00339206:
        ValueVectorOf<unsigned_int>::ensureExtraCapacity(pVVar25,1);
        XVar17 = pVVar25->fCurCount;
        pVVar25->fCurCount = XVar17 + 1;
        pVVar25->fElemList[XVar17] = local_6c;
      }
      else {
        pXVar18 = L"xmlns";
        if (pXVar13 == (XMLCh *)0x0) {
LAB_00339026:
          if (*pXVar18 == L'\0') goto LAB_003390c3;
        }
        else {
          pXVar18 = L"xmlns";
          do {
            XVar21 = *pXVar13;
            if (XVar21 == L'\0') goto LAB_00339026;
            pXVar13 = pXVar13 + 1;
            XVar3 = *pXVar18;
            pXVar18 = pXVar18 + 1;
          } while (XVar21 == XVar3);
        }
        pXVar13 = XMLAttr::getQName(this_01);
        iVar11 = XMLString::compareNString(pXVar13,L"xmlns:",6);
        if (iVar11 == 0) {
          pVVar25 = this->fURIs;
          pXVar13 = this_01->fAttName->fLocalPart;
          pRVar5 = (((this->super_XercesDOMParser).super_AbstractDOMParser.fScanner)->fElemStack).
                   fPrefixPool.fHashTable;
          if ((pXVar13 == (XMLCh *)0x0) || (uVar14 = (ulong)(ushort)*pXVar13, uVar14 == 0)) {
            uVar14 = 0;
          }
          else {
            XVar21 = pXVar13[1];
            if (XVar21 != L'\0') {
              pXVar18 = pXVar13 + 2;
              do {
                uVar14 = (ulong)(ushort)XVar21 + (uVar14 >> 0x18) + uVar14 * 0x26;
                XVar21 = *pXVar18;
                pXVar18 = pXVar18 + 1;
              } while (XVar21 != L'\0');
            }
            uVar14 = uVar14 % pRVar5->fHashModulus;
          }
          pRVar24 = pRVar5->fBucketList[uVar14];
          local_6c = 0;
          if (pRVar24 != (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0) {
            do {
              bVar10 = StringHasher::equals
                                 ((StringHasher *)&pRVar5->field_0x30,pXVar13,pRVar24->fKey);
              if (bVar10) {
                pPVar15 = pRVar24->fData;
                if (pPVar15 != (PoolElem *)0x0) {
LAB_00339200:
                  local_6c = pPVar15->fId;
                }
                break;
              }
              pRVar24 = pRVar24->fNext;
            } while (pRVar24 != (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0)
            ;
          }
          goto LAB_00339206;
        }
      }
      pXVar13 = XMLAttr::getQName(this_01);
      XMLBuffer::append(this_00,pXVar13);
      XVar17 = (this->fAnnotationBuf).fIndex;
      XVar20 = (this->fAnnotationBuf).fCapacity;
      if (XVar17 == XVar20) {
        XMLBuffer::ensureCapacity(this_00,1);
        XVar17 = (this->fAnnotationBuf).fIndex;
        XVar20 = (this->fAnnotationBuf).fCapacity;
      }
      pXVar13 = (this->fAnnotationBuf).fBuffer;
      XVar19 = XVar17 + 1;
      (this->fAnnotationBuf).fIndex = XVar19;
      pXVar13[XVar17] = L'=';
      if (XVar19 == XVar20) {
        XMLBuffer::ensureCapacity(this_00,1);
        XVar19 = (this->fAnnotationBuf).fIndex;
        pXVar13 = (this->fAnnotationBuf).fBuffer;
      }
      (this->fAnnotationBuf).fIndex = XVar19 + 1;
      pXVar13[XVar19] = L'\"';
      XMLBuffer::append(this_00,pXVar12);
      XVar17 = (this->fAnnotationBuf).fIndex;
      XVar20 = (this->fAnnotationBuf).fCapacity;
      if (XVar17 == XVar20) {
        XMLBuffer::ensureCapacity(this_00,1);
        XVar17 = (this->fAnnotationBuf).fIndex;
        XVar20 = (this->fAnnotationBuf).fCapacity;
      }
      pXVar12 = (this->fAnnotationBuf).fBuffer;
      XVar19 = XVar17 + 1;
      (this->fAnnotationBuf).fIndex = XVar19;
      pXVar12[XVar17] = L'\"';
      if (XVar19 == XVar20) {
        XMLBuffer::ensureCapacity(this_00,1);
        XVar19 = (this->fAnnotationBuf).fIndex;
        pXVar12 = (this->fAnnotationBuf).fBuffer;
      }
      this_00->fIndex = XVar19 + 1;
      pXVar12[XVar19] = L' ';
      XVar26 = XVar26 + 1;
    } while (XVar26 != attrCount);
  }
  this_02 = ElemStack::getNamespaceMap
                      (&((this->super_XercesDOMParser).super_AbstractDOMParser.fScanner)->fElemStack
                      );
  if (this_02->fCurCount != 0) {
    XVar26 = 0;
    do {
      ppPVar16 = ValueVectorOf<xercesc_4_0::PrefMapElem_*>::elementAt(this_02,XVar26);
      uVar4 = (*ppPVar16)->fPrefId;
      uVar14 = this->fURIs->fCurCount;
      if (uVar14 == 0) {
LAB_003393b7:
        pXVar8 = (this->super_XercesDOMParser).super_AbstractDOMParser.fScanner;
        if ((uVar4 == 0) || ((pXVar8->fElemStack).fPrefixPool.fCurId <= uVar4)) {
          this_03 = (IllegalArgumentException *)__cxa_allocate_exception(0x30);
          IllegalArgumentException::IllegalArgumentException
                    (this_03,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/StringPool.hpp"
                     ,0xa2,StrPool_IllegalId,(pXVar8->fElemStack).fPrefixPool.fMemoryManager);
          __cxa_throw(this_03,&IllegalArgumentException::typeinfo,XMLException::~XMLException);
        }
        pXVar12 = (pXVar8->fElemStack).fPrefixPool.fIdMap[uVar4]->fString;
        if (pXVar12 == L"") {
LAB_00339436:
          pXVar12 = L"xmlns";
        }
        else {
          pXVar13 = L"";
          if (pXVar12 == (XMLCh *)0x0) {
LAB_00339414:
            if (*pXVar13 == L'\0') goto LAB_00339436;
          }
          else {
            pXVar13 = L"";
            pXVar18 = pXVar12;
            do {
              XVar21 = *pXVar18;
              if (XVar21 == L'\0') goto LAB_00339414;
              pXVar18 = pXVar18 + 1;
              XVar3 = *pXVar13;
              pXVar13 = pXVar13 + 1;
            } while (XVar21 == XVar3);
          }
          XMLBuffer::append(this_00,L"xmlns:");
        }
        XMLBuffer::append(this_00,pXVar12);
        XVar17 = (this->fAnnotationBuf).fIndex;
        XVar20 = (this->fAnnotationBuf).fCapacity;
        if (XVar17 == XVar20) {
          XMLBuffer::ensureCapacity(this_00,1);
          XVar17 = (this->fAnnotationBuf).fIndex;
          XVar20 = (this->fAnnotationBuf).fCapacity;
        }
        pXVar12 = (this->fAnnotationBuf).fBuffer;
        XVar19 = XVar17 + 1;
        (this->fAnnotationBuf).fIndex = XVar19;
        pXVar12[XVar17] = L'=';
        if (XVar19 == XVar20) {
          XMLBuffer::ensureCapacity(this_00,1);
          XVar19 = (this->fAnnotationBuf).fIndex;
          pXVar12 = (this->fAnnotationBuf).fBuffer;
        }
        (this->fAnnotationBuf).fIndex = XVar19 + 1;
        pXVar12[XVar19] = L'\"';
        pXVar8 = (this->super_XercesDOMParser).super_AbstractDOMParser.fScanner;
        ppPVar16 = ValueVectorOf<xercesc_4_0::PrefMapElem_*>::elementAt(this_02,XVar26);
        pXVar12 = XMLScanner::getURIText(pXVar8,(*ppPVar16)->fURIId);
        XMLBuffer::append(this_00,pXVar12);
        XVar17 = (this->fAnnotationBuf).fIndex;
        XVar20 = (this->fAnnotationBuf).fCapacity;
        if (XVar17 == XVar20) {
          XMLBuffer::ensureCapacity(this_00,1);
          XVar17 = (this->fAnnotationBuf).fIndex;
          XVar20 = (this->fAnnotationBuf).fCapacity;
        }
        pXVar12 = (this->fAnnotationBuf).fBuffer;
        XVar19 = XVar17 + 1;
        (this->fAnnotationBuf).fIndex = XVar19;
        pXVar12[XVar17] = L'\"';
        if (XVar19 == XVar20) {
          XMLBuffer::ensureCapacity(this_00,1);
          XVar19 = (this->fAnnotationBuf).fIndex;
          pXVar12 = (this->fAnnotationBuf).fBuffer;
        }
        (this->fAnnotationBuf).fIndex = XVar19 + 1;
        pXVar12[XVar19] = L' ';
        pVVar25 = this->fURIs;
        ValueVectorOf<unsigned_int>::ensureExtraCapacity(pVVar25,1);
        XVar17 = pVVar25->fCurCount;
        pVVar25->fCurCount = XVar17 + 1;
        pVVar25->fElemList[XVar17] = uVar4;
      }
      else {
        puVar7 = this->fURIs->fElemList;
        if (*puVar7 != uVar4) {
          uVar9 = 1;
          do {
            uVar23 = uVar9;
            if (uVar14 == uVar23) break;
            uVar9 = uVar23 + 1;
          } while (puVar7[uVar23] != uVar4);
          if (uVar14 <= uVar23) goto LAB_003393b7;
        }
      }
      XVar26 = XVar26 + 1;
    } while (XVar26 < this_02->fCurCount);
  }
  XVar26 = (this->fAnnotationBuf).fIndex;
  XVar17 = (this->fAnnotationBuf).fCapacity;
  if (XVar26 == XVar17) {
    XMLBuffer::ensureCapacity(this_00,1);
    XVar26 = (this->fAnnotationBuf).fIndex;
    XVar17 = (this->fAnnotationBuf).fCapacity;
  }
  pXVar12 = (this->fAnnotationBuf).fBuffer;
  XVar20 = XVar26 + 1;
  (this->fAnnotationBuf).fIndex = XVar20;
  pXVar12[XVar26] = L'>';
  if (XVar20 == XVar17) {
    XMLBuffer::ensureCapacity(this_00,1);
    XVar20 = (this->fAnnotationBuf).fIndex;
    pXVar12 = (this->fAnnotationBuf).fBuffer;
  }
  this_00->fIndex = XVar20 + 1;
  pXVar12[XVar20] = L'\n';
  return;
}

Assistant:

void XSDDOMParser::startAnnotation( const XMLElementDecl&       elemDecl
                                  , const RefVectorOf<XMLAttr>& attrList
                                  , const XMLSize_t             attrCount)
{
    fAnnotationBuf.append(chOpenAngle);
	fAnnotationBuf.append(elemDecl.getFullName());
    fAnnotationBuf.append(chSpace);

    // attributes are a bit of a pain.  To get this right, we have to keep track
    // of the namespaces we've seen declared, then examine the namespace context
    // for other namespaces so that we can also include them.
    // optimized for simplicity and the case that not many
    // namespaces are declared on this annotation...
    fURIs->removeAllElements();
    for (XMLSize_t i=0; i < attrCount; i++) {

        const XMLAttr* oneAttrib = attrList.elementAt(i);
        const XMLCh* attrValue = oneAttrib->getValue();

        if (XMLString::equals(oneAttrib->getName(), XMLUni::fgXMLNSString))
            fURIs->addElement(fScanner->getPrefixId(XMLUni::fgZeroLenString));
        else  if (!XMLString::compareNString(oneAttrib->getQName(), XMLUni::fgXMLNSColonString, 6))
            fURIs->addElement(fScanner->getPrefixId(oneAttrib->getName()));

        fAnnotationBuf.append(oneAttrib->getQName());
        fAnnotationBuf.append(chEqual);
        fAnnotationBuf.append(chDoubleQuote);
        fAnnotationBuf.append(attrValue);
        fAnnotationBuf.append(chDoubleQuote);
        fAnnotationBuf.append(chSpace);
    }

    // now we have to look through currently in-scope namespaces to see what
    // wasn't declared here
    ValueVectorOf<PrefMapElem*>* namespaceContext = fScanner->getNamespaceContext();
    for (XMLSize_t j=0; j < namespaceContext->size(); j++)
    {
        unsigned int prefId = namespaceContext->elementAt(j)->fPrefId;

        if (!fURIs->containsElement(prefId)) {

            const XMLCh* prefix = fScanner->getPrefixForId(prefId);

            if (XMLString::equals(prefix, XMLUni::fgZeroLenString)) {
                fAnnotationBuf.append(XMLUni::fgXMLNSString);
            }
            else  {
                fAnnotationBuf.append(XMLUni::fgXMLNSColonString);
                fAnnotationBuf.append(prefix);
            }

            fAnnotationBuf.append(chEqual);
            fAnnotationBuf.append(chDoubleQuote);
            fAnnotationBuf.append(fScanner->getURIText(namespaceContext->elementAt(j)->fURIId));
            fAnnotationBuf.append(chDoubleQuote);
            fAnnotationBuf.append(chSpace);

            fURIs->addElement(prefId);
        }
    }

    fAnnotationBuf.append(chCloseAngle);
    fAnnotationBuf.append(chLF);
}